

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O0

size_t __thiscall
axl::enc::CharCodec::encode_utf32
          (CharCodec *this,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,StringRef_utf32 *string
          ,utf32_t replacement)

{
  size_t sVar1;
  undefined4 in_ECX;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_RDX;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RSI;
  long *in_RDI;
  undefined1 auVar2 [16];
  size_t size;
  ConvertLengthResult result;
  char tmpBuffer [256];
  utf32_t *end;
  utf32_t *p;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  Array<char,_axl::sl::ArrayDetails<char>_> *this_00;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  Array<char,_axl::sl::ArrayDetails<char>_> local_168;
  undefined1 local_148 [16];
  undefined1 local_138 [256];
  C *local_38;
  C *local_30;
  undefined4 local_24;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *local_20;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *local_18;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x187e50);
  local_30 = sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::cp(local_20);
  local_38 = sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::getEnd(local_20);
  auVar2._8_8_ = in_stack_fffffffffffffe68;
  auVar2._0_8_ = in_stack_fffffffffffffe70;
  while( true ) {
    if (local_38 <= local_30) break;
    this_00 = &local_168;
    sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::StringRefBase
              (auVar2._0_8_,auVar2._8_8_,(size_t)this_00,(bool)in_stack_fffffffffffffe5f);
    auVar2 = (**(code **)(*in_RDI + 0x40))(in_RDI,local_138,0x100,this_00,local_24);
    local_148 = auVar2;
    sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::~StringRefBase
              ((StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *)0x187f07);
    if (local_148._8_8_ == 0) break;
    sVar1 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                      (this_00,(char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)
                       ,0x187f42);
    if (sVar1 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    local_30 = local_30 + local_148._8_8_;
  }
  sVar1 = sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(local_18);
  return sVar1;
}

Assistant:

size_t
CharCodec::encode_utf32(
	sl::Array<char>* buffer,
	const sl::StringRef_utf32& string,
	utf32_t replacement
) {
	buffer->clear();

	const utf32_t* p = string.cp();
	const utf32_t* end = string.getEnd();
	while (p < end) {
		char tmpBuffer[256];
		ConvertLengthResult result = encode_utf32(
			tmpBuffer,
			sizeof(tmpBuffer),
			sl::StringRef_utf32(p, end - p),
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t size = buffer->append(tmpBuffer, result.m_dstLength);
		if (size == -1)
			return -1;

		p += result.m_srcLength;
	}

	return buffer->getCount();
}